

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib560.c
# Opt level: O0

int test(char *URL)

{
  FILE *pFVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  uint *puVar6;
  char *pcVar7;
  timeval tVar8;
  timeval older;
  timeval older_00;
  timeval older_01;
  CURLMcode ec_8;
  int ec_7;
  CURLMcode ec_6;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int maxfd;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  timeval timeout;
  CURLMcode ec_5;
  CURLMcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_30;
  uint local_28;
  uint local_24;
  int still_running;
  int res;
  CURLM *multi_handle;
  CURL *http_handle;
  char *URL_local;
  
  multi_handle = (CURLM *)0x0;
  _still_running = 0;
  local_24 = 0;
  http_handle = URL;
  tVar8 = tutil_tvnow();
  _ec_1 = tVar8.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_30 = tVar8.tv_usec;
  tv_test_start.tv_usec = local_30;
  multi_handle = (CURLM *)curl_easy_init();
  if (multi_handle == (CURLM *)0x0) {
    fprintf(_stderr,"%s:%d curl_easy_init() failed\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
            ,0x36);
    local_24 = 0x7c;
  }
  if (local_24 == 0) {
    uVar2 = curl_easy_setopt(multi_handle,0x2712,http_handle);
    pFVar1 = _stderr;
    if (uVar2 != 0) {
      uVar4 = curl_easy_strerror(uVar2);
      fprintf(pFVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
              ,0x39,(ulong)uVar2,uVar4);
      local_24 = uVar2;
    }
    if (local_24 == 0) {
      uVar2 = curl_easy_setopt(multi_handle,0x2a,1);
      pFVar1 = _stderr;
      if (uVar2 != 0) {
        uVar4 = curl_easy_strerror(uVar2);
        fprintf(pFVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                ,0x3a,(ulong)uVar2,uVar4);
        local_24 = uVar2;
      }
      if (local_24 == 0) {
        uVar2 = curl_easy_setopt(multi_handle,0x40,0);
        pFVar1 = _stderr;
        if (uVar2 != 0) {
          uVar4 = curl_easy_strerror(uVar2);
          fprintf(pFVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                  ,0x3b,(ulong)uVar2,uVar4);
          local_24 = uVar2;
        }
        if (local_24 == 0) {
          uVar2 = curl_easy_setopt(multi_handle,0x51,0);
          pFVar1 = _stderr;
          if (uVar2 != 0) {
            uVar4 = curl_easy_strerror(uVar2);
            fprintf(pFVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                    ,0x3c,(ulong)uVar2,uVar4);
            local_24 = uVar2;
          }
          if (local_24 == 0) {
            _still_running = curl_multi_init();
            if (_still_running == 0) {
              fprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                      ,0x3f);
              local_24 = 0x7b;
            }
            if (local_24 == 0) {
              uVar2 = curl_multi_add_handle(_still_running,multi_handle);
              pFVar1 = _stderr;
              if (uVar2 != 0) {
                uVar4 = curl_multi_strerror(uVar2);
                fprintf(pFVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                        ,0x42,(ulong)uVar2,uVar4);
                local_24 = uVar2;
              }
              if (local_24 == 0) {
                uVar2 = curl_multi_perform(_still_running,&local_28);
                pFVar1 = _stderr;
                if (uVar2 == 0) {
                  if ((int)local_28 < 0) {
                    fprintf(_stderr,
                            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                            ,0x45,(ulong)local_28);
                    local_24 = 0x7a;
                  }
                }
                else {
                  uVar4 = curl_multi_strerror(uVar2);
                  fprintf(pFVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                          ,0x45,(ulong)uVar2,uVar4);
                  local_24 = uVar2;
                }
                if (local_24 == 0) {
                  tVar8 = tutil_tvnow();
                  older.tv_usec = tv_test_start.tv_usec;
                  older.tv_sec = tv_test_start.tv_sec;
                  lVar5 = tutil_tvdiff(tVar8,older);
                  if (60000 < lVar5) {
                    fprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                            ,0x47);
                    local_24 = 0x7d;
                  }
                  while ((local_24 == 0 && (local_28 != 0))) {
                    __arr._4_4_ = 0xffffff9d;
                    for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
                      fdwrite.__fds_bits[(ulong)(uint)__arr + 0xf] = 0;
                    }
                    for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1)
                    {
                      fdexcep.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
                    }
                    for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1)
                    {
                      (&__i + (ulong)__arr_2._4_4_ * 2)[0] = 0;
                      (&__i + (ulong)__arr_2._4_4_ * 2)[1] = 0;
                    }
                    fdread.__fds_bits[0xf] = 1;
                    uVar2 = curl_multi_fdset(_still_running,fdwrite.__fds_bits + 0xf,
                                             fdexcep.__fds_bits + 0xf,&__i,(long)&__arr + 4);
                    pFVar1 = _stderr;
                    if (uVar2 == 0) {
                      if ((int)__arr._4_4_ < -1) {
                        fprintf(_stderr,
                                "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                                ,0x5a,(ulong)__arr._4_4_);
                        local_24 = 0x7a;
                      }
                    }
                    else {
                      uVar4 = curl_multi_strerror(uVar2);
                      fprintf(pFVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                              ,0x5a,(ulong)uVar2,uVar4);
                      local_24 = uVar2;
                    }
                    if (local_24 != 0) break;
                    iVar3 = select_wrapper(__arr._4_4_ + 1,(fd_set *)(fdwrite.__fds_bits + 0xf),
                                           (fd_set *)(fdexcep.__fds_bits + 0xf),(fd_set *)&__i,
                                           (timeval *)(fdread.__fds_bits + 0xf));
                    if (iVar3 == -1) {
                      puVar6 = (uint *)__errno_location();
                      pFVar1 = _stderr;
                      uVar2 = *puVar6;
                      pcVar7 = strerror(uVar2);
                      fprintf(pFVar1,"%s:%d select() failed, with errno %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                              ,0x5e,(ulong)uVar2,pcVar7);
                      local_24 = 0x79;
                    }
                    if (local_24 != 0) break;
                    tVar8 = tutil_tvnow();
                    older_00.tv_usec = tv_test_start.tv_usec;
                    older_00.tv_sec = tv_test_start.tv_sec;
                    lVar5 = tutil_tvdiff(tVar8,older_00);
                    if (60000 < lVar5) {
                      fprintf(_stderr,
                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                              ,0x60);
                      local_24 = 0x7d;
                    }
                    if (local_24 != 0) break;
                    uVar2 = curl_multi_perform(_still_running,&local_28);
                    pFVar1 = _stderr;
                    if (uVar2 == 0) {
                      if ((int)local_28 < 0) {
                        fprintf(_stderr,
                                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                                ,99,(ulong)local_28);
                        local_24 = 0x7a;
                      }
                    }
                    else {
                      uVar4 = curl_multi_strerror(uVar2);
                      fprintf(pFVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                              ,99,(ulong)uVar2,uVar4);
                      local_24 = uVar2;
                    }
                    if (local_24 != 0) break;
                    tVar8 = tutil_tvnow();
                    older_01.tv_usec = tv_test_start.tv_usec;
                    older_01.tv_sec = tv_test_start.tv_sec;
                    lVar5 = tutil_tvdiff(tVar8,older_01);
                    if (60000 < lVar5) {
                      fprintf(_stderr,
                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib560.c"
                              ,0x65);
                      local_24 = 0x7d;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  curl_multi_cleanup(_still_running);
  curl_easy_cleanup(multi_handle);
  curl_global_cleanup();
  return local_24;
}

Assistant:

int test(char *URL)
{
  CURL *http_handle = NULL;
  CURLM *multi_handle = NULL;
  int res = 0;

  int still_running; /* keep number of running handles */

  start_test_timing();

  /*
  ** curl_global_init called indirectly from curl_easy_init.
  */

  easy_init(http_handle);

  /* set options */
  easy_setopt(http_handle, CURLOPT_URL, URL);
  easy_setopt(http_handle, CURLOPT_HEADER, 1L);
  easy_setopt(http_handle, CURLOPT_SSL_VERIFYPEER, 0L);
  easy_setopt(http_handle, CURLOPT_SSL_VERIFYHOST, 0L);

  /* init a multi stack */
  multi_init(multi_handle);

  /* add the individual transfers */
  multi_add_handle(multi_handle, http_handle);

  /* we start some action by calling perform right away */
  multi_perform(multi_handle, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;

    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    /* set a suitable timeout to play around with */
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    /* get file descriptors from the transfers */
    multi_fdset(multi_handle, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    /* timeout or readable/writable sockets */
    multi_perform(multi_handle, &still_running);

    abort_on_test_timeout();
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi_handle);
  curl_easy_cleanup(http_handle);
  curl_global_cleanup();

  return res;
}